

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_thingstoblowup.cpp
# Opt level: O3

int AF_A_Explode512(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  uint uVar6;
  AActor *bombspot;
  VMValue *pVVar7;
  AActor *pAVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005fd04d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    bombspot = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (bombspot == (AActor *)0x0) {
LAB_005fced5:
        bombspot = (AActor *)0x0;
        pVVar7 = param;
        uVar6 = numparam;
      }
      else {
        pPVar5 = (bombspot->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(bombspot->super_DThinker).super_DObject._vptr_DObject)(bombspot);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (bombspot->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar9 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        bVar10 = pPVar5 == pPVar3;
        if (!bVar10 && !bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar10 || bVar9);
        uVar6 = (uint)bVar9;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005fd04d;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_005fd03d;
          puVar2 = (undefined8 *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (puVar2 != (undefined8 *)0x0) {
              pPVar5 = (PClass *)puVar2[1];
              if (pPVar5 == (PClass *)0x0) {
                pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar6,ret);
                puVar2[1] = pPVar5;
              }
              bVar9 = pPVar5 != (PClass *)0x0;
              if (pPVar5 != pPVar3 && bVar9) {
                do {
                  pPVar5 = pPVar5->ParentClass;
                  bVar9 = pPVar5 != (PClass *)0x0;
                  if (pPVar5 == pPVar3) break;
                } while (pPVar5 != (PClass *)0x0);
              }
              if (!bVar9) {
                __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_005fd04d;
              }
            }
          }
          else if (puVar2 != (undefined8 *)0x0) goto LAB_005fd03d;
        }
        if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
           ((VVar1 != '\x03' ||
            ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))))
        {
          __assertion = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
          ;
          goto LAB_005fd04d;
        }
      }
      pAVar8 = (bombspot->target).field_0.p;
      if (pAVar8 != (AActor *)0x0) {
        if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005fcfb6;
        (bombspot->target).field_0.p = (AActor *)0x0;
      }
      pAVar8 = (AActor *)0x0;
LAB_005fcfb6:
      local_2c.Index = 0;
      P_RadiusAttack(bombspot,pAVar8,0x200,0x200,&local_2c,1,0);
      pAVar8 = (bombspot->target).field_0.p;
      if (pAVar8 != (AActor *)0x0) {
        if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (pAVar8->player != (player_t *)0x0) {
            pAVar8->player->extralight = 5;
          }
        }
        else {
          (bombspot->target).field_0.p = (AActor *)0x0;
        }
      }
      P_CheckSplash(bombspot,512.0);
      bombspot->RenderStyle = LegacyRenderStyles[7];
      return 0;
    }
    if (bombspot == (AActor *)0x0) goto LAB_005fced5;
  }
LAB_005fd03d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005fd04d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_thingstoblowup.cpp"
                ,0x4d,"int AF_A_Explode512(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Explode512)
{
	PARAM_ACTION_PROLOGUE;

	P_RadiusAttack (self, self->target, 512, 512, NAME_None, RADF_HURTSOURCE);
	if (self->target != NULL && self->target->player != NULL)
	{
		self->target->player->extralight = 5;
	}
	P_CheckSplash(self, 512);

	// Strife didn't do this next part, but it looks good
	self->RenderStyle = STYLE_Add;
	return 0;
}